

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O2

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo3(Segment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double m10;
  double m01;
  double local_80;
  uint64_t local_78;
  double m00;
  uint64_t local_68 [7];
  
  m00 = 0.0;
  m01 = 0.0;
  local_80 = getNormalMoment(this,(uint64_t *)&m00,(uint64_t *)&m01);
  m01 = 0.0;
  m10 = 4.94065645841247e-324;
  m00 = local_80;
  m01 = getNormalMoment(this,(uint64_t *)&m01,(uint64_t *)&m10);
  m10 = 4.94065645841247e-324;
  local_78 = 0;
  m10 = getNormalMoment(this,(uint64_t *)&m10,&local_78);
  local_78 = 3;
  local_68[6] = 0;
  dVar1 = getCentralMoment(this,&local_78,local_68 + 6,&m00,&m10,&m01);
  local_68[5] = 1;
  local_68[4] = 2;
  dVar2 = getCentralMoment(this,local_68 + 5,local_68 + 4,&m00,&m10,&m01);
  dVar1 = dVar1 - dVar2 * 3.0;
  local_68[3] = 2;
  local_68[2] = 1;
  dVar2 = getCentralMoment(this,local_68 + 3,local_68 + 2,&m00,&m10,&m01);
  local_68[1] = 0;
  local_68[0] = 3;
  dVar3 = getCentralMoment(this,local_68 + 1,local_68,&m00,&m10,&m01);
  dVar3 = dVar2 * 3.0 - dVar3;
  dVar2 = pow(local_80,5.0);
  return (dVar3 * dVar3 + dVar1 * dVar1) / dVar2;
}

Assistant:

const double
Segment::getHuMomentInvariantNo3()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            std::pow(
                (
                    (1 * this->getCentralMoment(3, 0, m00, m10, m01)) -
                    (3 * this->getCentralMoment(1, 2, m00, m10, m01))
                ),
                2
            )
            +
            std::pow(
                (
                    (3 * this->getCentralMoment(2, 1, m00, m10, m01)) -
                    (1 * this->getCentralMoment(0, 3, m00, m10, m01))
                ),
                2
            )
        )
        /
        std::pow(m00, 5)
    );
}